

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrfmt.cpp
# Opt level: O3

int32_t uprv_itou_63(UChar *buffer,int32_t capacity,uint32_t i,uint32_t radix,int32_t minwidth)

{
  long lVar1;
  UChar UVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  UChar *pUVar16;
  int iVar18;
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  
  pUVar16 = buffer + 7;
  uVar15 = 0;
  do {
    sVar6 = (short)((ulong)i % (ulong)radix);
    UVar2 = sVar6 + L'0';
    if (9 < (int)((ulong)i % (ulong)radix)) {
      UVar2 = sVar6 + L'7';
    }
    uVar15 = uVar15 + 1;
    pUVar16[-7] = UVar2;
    auVar11 = _DAT_002fd830;
    auVar10 = _DAT_002fd820;
    auVar9 = _DAT_002f48a0;
    auVar8 = _DAT_002f4890;
    auVar7 = _DAT_002f4880;
    pUVar16 = pUVar16 + 1;
  } while ((radix <= i) && (i = i / radix, (long)uVar15 < (long)capacity));
  uVar14 = (uint)uVar15;
  uVar12 = uVar14;
  if ((int)uVar14 < minwidth) {
    lVar1 = ((uint)minwidth - uVar15) + -1;
    auVar17._8_4_ = (int)lVar1;
    auVar17._0_8_ = lVar1;
    auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
    uVar13 = 0;
    auVar17 = auVar17 ^ _DAT_002f48a0;
    do {
      auVar29._8_4_ = (int)uVar13;
      auVar29._0_8_ = uVar13;
      auVar29._12_4_ = (int)(uVar13 >> 0x20);
      auVar21 = (auVar29 | auVar8) ^ auVar9;
      iVar30 = auVar17._0_4_;
      iVar36 = -(uint)(iVar30 < auVar21._0_4_);
      iVar18 = auVar17._4_4_;
      auVar22._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar35 = auVar17._8_4_;
      iVar38 = -(uint)(iVar35 < auVar21._8_4_);
      iVar19 = auVar17._12_4_;
      auVar22._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar32._4_4_ = iVar36;
      auVar32._0_4_ = iVar36;
      auVar32._8_4_ = iVar38;
      auVar32._12_4_ = iVar38;
      auVar39 = pshuflw(in_XMM11,auVar32,0xe8);
      auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar41 = pshuflw(in_XMM12,auVar24,0xe8);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar40 = pshuflw(auVar39,auVar22,0xe8);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar40 | auVar41 & auVar39) ^ auVar21;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pUVar16[-7] = L'0';
      }
      auVar22 = auVar24 & auVar32 | auVar22;
      auVar21 = packssdw(auVar22,auVar22);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar40,auVar21 ^ auVar40);
      if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
        pUVar16[-6] = L'0';
      }
      auVar21 = (auVar29 | auVar7) ^ auVar9;
      iVar36 = -(uint)(iVar30 < auVar21._0_4_);
      auVar37._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar38 = -(uint)(iVar35 < auVar21._8_4_);
      auVar37._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar23._4_4_ = iVar36;
      auVar23._0_4_ = iVar36;
      auVar23._8_4_ = iVar38;
      auVar23._12_4_ = iVar38;
      auVar31._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar31._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar21 = auVar31 & auVar23 | auVar37;
      auVar21 = packssdw(auVar21,auVar21);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pUVar16[-5] = L'0';
      }
      auVar24 = pshufhw(auVar23,auVar23,0x84);
      auVar32 = pshufhw(auVar31,auVar31,0x84);
      auVar22 = pshufhw(auVar24,auVar37,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar22 | auVar32 & auVar24) ^ auVar25;
      auVar24 = packssdw(auVar25,auVar25);
      if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pUVar16[-4] = L'0';
      }
      auVar24 = (auVar29 | auVar11) ^ auVar9;
      iVar36 = -(uint)(iVar30 < auVar24._0_4_);
      auVar27._4_4_ = -(uint)(iVar18 < auVar24._4_4_);
      iVar38 = -(uint)(iVar35 < auVar24._8_4_);
      auVar27._12_4_ = -(uint)(iVar19 < auVar24._12_4_);
      auVar33._4_4_ = iVar36;
      auVar33._0_4_ = iVar36;
      auVar33._8_4_ = iVar38;
      auVar33._12_4_ = iVar38;
      auVar21 = pshuflw(auVar21,auVar33,0xe8);
      auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar18);
      auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar19);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar24 = pshuflw(auVar41 & auVar39,auVar26,0xe8);
      in_XMM12 = auVar24 & auVar21;
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar21 = pshuflw(auVar21,auVar27,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar21 | in_XMM12) ^ auVar39;
      in_XMM11 = packssdw(auVar39,auVar39);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pUVar16[-3] = L'0';
      }
      auVar27 = auVar26 & auVar33 | auVar27;
      auVar21 = packssdw(auVar27,auVar27);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
      if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pUVar16[-2] = L'0';
      }
      auVar21 = (auVar29 | auVar10) ^ auVar9;
      iVar30 = -(uint)(iVar30 < auVar21._0_4_);
      auVar34._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar35 = -(uint)(iVar35 < auVar21._8_4_);
      auVar34._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar28._4_4_ = iVar30;
      auVar28._0_4_ = iVar30;
      auVar28._8_4_ = iVar35;
      auVar28._12_4_ = iVar35;
      auVar20._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar20._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar21 = auVar20 & auVar28 | auVar34;
      auVar21 = packssdw(auVar21,auVar21);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pUVar16[-1] = L'0';
      }
      auVar29 = pshufhw(auVar28,auVar28,0x84);
      auVar21 = pshufhw(auVar20,auVar20,0x84);
      auVar24 = pshufhw(auVar29,auVar34,0x84);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 & auVar29,(auVar24 | auVar21 & auVar29) ^ auVar5);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *pUVar16 = L'0';
      }
      uVar13 = uVar13 + 8;
      pUVar16 = pUVar16 + 8;
      uVar12 = minwidth;
    } while ((((uint)minwidth - uVar15) + 7 & 0xfffffffffffffff8) != uVar13);
  }
  if ((int)uVar12 < capacity) {
    buffer[uVar12] = L'\0';
  }
  if (1 < uVar12) {
    uVar13 = (ulong)(uint)minwidth;
    if (minwidth <= (int)uVar14) {
      uVar13 = uVar15;
    }
    pUVar16 = buffer + (uVar13 & 0xffffffff);
    uVar15 = 0;
    do {
      pUVar16 = pUVar16 + -1;
      UVar2 = *pUVar16;
      *pUVar16 = buffer[uVar15];
      buffer[uVar15] = UVar2;
      uVar15 = uVar15 + 1;
    } while ((uVar13 >> 1 & 0x7fffffff) != uVar15);
  }
  return uVar12;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_itou (UChar * buffer, int32_t capacity,
           uint32_t i, uint32_t radix, int32_t minwidth)
{
    int32_t length = 0;
    int digit;
    int32_t j;
    UChar temp;

    do{
        digit = (int)(i % radix);
        buffer[length++]=(UChar)(digit<=9?(0x0030+digit):(0x0030+digit+7));
        i=i/radix;
    } while(i && length<capacity);

    while (length < minwidth){
        buffer[length++] = (UChar) 0x0030;/*zero padding */
    }
    /* null terminate the buffer */
    if(length<capacity){
        buffer[length] = (UChar) 0x0000;
    }

    /* Reverses the string */
    for (j = 0; j < (length / 2); j++){
        temp = buffer[(length-1) - j];
        buffer[(length-1) - j] = buffer[j];
        buffer[j] = temp;
    }
    return length;
}